

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O2

int hash_block(gost_hash_ctx *ctx,byte *block,size_t length)

{
  int iVar1;
  byte *right;
  byte *right_00;
  size_t __n;
  
  iVar1 = ctx->left;
  if ((long)iVar1 != 0) {
    __n = length & 0xffffffff;
    if (0x20U - iVar1 <= length) {
      __n = (size_t)(0x20U - iVar1);
    }
    memcpy(ctx->remainder + iVar1,block,__n);
    iVar1 = (int)__n + ctx->left;
    ctx->left = iVar1;
    if (iVar1 < 0x20) {
      return 1;
    }
    block = block + __n;
    length = length - __n;
    hash_step(ctx->cipher_ctx,ctx->H,ctx->remainder);
    add_blocks((int)ctx + 0x34,ctx->remainder,right);
    ctx->len = ctx->len + 0x20;
    ctx->left = 0;
  }
  for (; 0x1f < length; length = length - 0x20) {
    hash_step(ctx->cipher_ctx,ctx->H,block);
    add_blocks((int)ctx + 0x34,block,right_00);
    ctx->len = ctx->len + 0x20;
    block = block + 0x20;
  }
  if (length != 0) {
    ctx->left = (int)length;
    memcpy(ctx->remainder,block,length);
  }
  return 1;
}

Assistant:

int hash_block(gost_hash_ctx * ctx, const byte * block, size_t length)
{
    if (ctx->left) {
        /*
         * There are some bytes from previous step
         */
        unsigned int add_bytes = 32 - ctx->left;
        if (add_bytes > length) {
            add_bytes = length;
        }
        memcpy(&(ctx->remainder[ctx->left]), block, add_bytes);
        ctx->left += add_bytes;
        if (ctx->left < 32) {
            return 1;
        }
        block += add_bytes;
        length -= add_bytes;
        hash_step(ctx->cipher_ctx, ctx->H, ctx->remainder);
        add_blocks(32, ctx->S, ctx->remainder);
        ctx->len += 32;
        ctx->left = 0;
    }
    while (length >= 32) {
        hash_step(ctx->cipher_ctx, ctx->H, block);

        add_blocks(32, ctx->S, block);
        ctx->len += 32;
        block += 32;
        length -= 32;
    }
    if (length) {
        memcpy(ctx->remainder, block, ctx->left = length);
    }
    return 1;
}